

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.cpp
# Opt level: O1

int __thiscall RegEx::PreProcessClosure(RegEx *this)

{
  char *pcVar1;
  char cVar2;
  void *pvVar3;
  
  PreProcessLiterals(this);
  cVar2 = this->m_CurPreProcChar;
  if (cVar2 != '\0') {
    do {
      pvVar3 = memchr("*+?",(int)cVar2,4);
      if (pvVar3 == (void *)0x0) {
        return 0;
      }
      std::__cxx11::string::push_back((char)this + ' ');
      pcVar1 = this->m_InfixRegEx;
      this->m_InfixRegEx = pcVar1 + 1;
      cVar2 = *pcVar1;
      this->m_CurPreProcChar = cVar2;
    } while (cVar2 != '\0');
  }
  return 0;
}

Assistant:

int RegEx::PreProcessClosure() {
	PreProcessLiterals();
	while (m_CurPreProcChar != '\0' && strchr("*+?",m_CurPreProcChar) != NULL) {
		m_PostStrRegEx += m_CurPreProcChar;
		m_CurPreProcChar = *(m_InfixRegEx++);
	}
	return 0;
}